

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct16_low8_ssse3(__m128i *input,__m128i *output)

{
  int32_t *cospi;
  int8_t cos_bit;
  __m128i _in0;
  undefined1 auVar2 [16];
  undefined4 uVar3;
  __m128i _in0_1;
  __m128i _in0_2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  __m128i _in1;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  __m128i _in0_3;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i _in1_1;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __m128i _in1_2;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i _in1_3;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i __rounding;
  __m128i __rounding_00;
  __m128i local_118;
  __m128i local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  longlong lVar1;
  longlong extraout_RDX;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  auVar2 = pshuflw(ZEXT416(0xc88),ZEXT416(0xc88),0);
  auVar2._4_4_ = auVar2._0_4_;
  auVar2._8_4_ = auVar2._0_4_;
  auVar2._12_4_ = auVar2._0_4_;
  auVar4 = pshuflw(ZEXT416(0x7f60),ZEXT416(0x7f60),0);
  auVar36._0_4_ = auVar4._0_4_;
  auVar36._4_4_ = auVar36._0_4_;
  auVar36._8_4_ = auVar36._0_4_;
  auVar36._12_4_ = auVar36._0_4_;
  auVar2 = pmulhrsw(auVar2,(undefined1  [16])input[1]);
  auVar5 = pmulhrsw(auVar36,(undefined1  [16])input[1]);
  auVar4 = pshuflw(ZEXT416(0xffffaed0),ZEXT416(0xffffaed0),0);
  uVar3 = auVar4._0_4_;
  auVar19._4_4_ = uVar3;
  auVar19._0_4_ = uVar3;
  auVar19._8_4_ = uVar3;
  auVar19._12_4_ = uVar3;
  auVar4 = pshuflw(ZEXT416(0x62f0),ZEXT416(0x62f0),0);
  auVar10._0_4_ = auVar4._0_4_;
  auVar10._4_4_ = auVar10._0_4_;
  auVar10._8_4_ = auVar10._0_4_;
  auVar10._12_4_ = auVar10._0_4_;
  auVar20 = pmulhrsw(auVar19,(undefined1  [16])input[7]);
  auVar11 = pmulhrsw(auVar10,(undefined1  [16])input[7]);
  auVar4 = pshuflw(ZEXT416(0x3c58),ZEXT416(0x3c58),0);
  uVar3 = auVar4._0_4_;
  auVar29._4_4_ = uVar3;
  auVar29._0_4_ = uVar3;
  auVar29._8_4_ = uVar3;
  auVar29._12_4_ = uVar3;
  auVar4 = pshuflw(ZEXT416(0x70e0),ZEXT416(0x70e0),0);
  uVar3 = auVar4._0_4_;
  auVar31._4_4_ = uVar3;
  auVar31._0_4_ = uVar3;
  auVar31._8_4_ = uVar3;
  auVar31._12_4_ = uVar3;
  auVar30 = pmulhrsw(auVar29,(undefined1  [16])input[5]);
  auVar32 = pmulhrsw(auVar31,(undefined1  [16])input[5]);
  auVar4 = pshuflw(ZEXT416(0xffffdad8),ZEXT416(0xffffdad8),0);
  uVar3 = auVar4._0_4_;
  auVar35._4_4_ = uVar3;
  auVar35._0_4_ = uVar3;
  auVar35._8_4_ = uVar3;
  auVar35._12_4_ = uVar3;
  auVar4 = pshuflw(ZEXT416(0x7a80),ZEXT416(0x7a80),0);
  auVar37._0_4_ = auVar4._0_4_;
  auVar37._4_4_ = auVar37._0_4_;
  auVar37._8_4_ = auVar37._0_4_;
  auVar37._12_4_ = auVar37._0_4_;
  auVar36 = pmulhrsw(auVar35,(undefined1  [16])input[3]);
  auVar4 = pmulhrsw(auVar37,(undefined1  [16])input[3]);
  auVar24 = pshuflw(ZEXT416(0x18f8),ZEXT416(0x18f8),0);
  uVar3 = auVar24._0_4_;
  auVar27._4_4_ = uVar3;
  auVar27._0_4_ = uVar3;
  auVar27._8_4_ = uVar3;
  auVar27._12_4_ = uVar3;
  auVar24 = pshuflw(ZEXT416(0x7d88),ZEXT416(0x7d88),0);
  auVar25._0_4_ = auVar24._0_4_;
  auVar25._4_4_ = auVar25._0_4_;
  auVar25._8_4_ = auVar25._0_4_;
  auVar25._12_4_ = auVar25._0_4_;
  auVar28 = pmulhrsw(auVar27,(undefined1  [16])input[2]);
  auVar26 = pmulhrsw(auVar25,(undefined1  [16])input[2]);
  auVar24 = pshuflw(ZEXT416(0xffffb8e0),ZEXT416(0xffffb8e0),0);
  uVar3 = auVar24._0_4_;
  auVar33._4_4_ = uVar3;
  auVar33._0_4_ = uVar3;
  auVar33._8_4_ = uVar3;
  auVar33._12_4_ = uVar3;
  auVar24 = pshuflw(ZEXT416(0x6a70),ZEXT416(0x6a70),0);
  auVar22._0_4_ = auVar24._0_4_;
  auVar22._4_4_ = auVar22._0_4_;
  auVar22._8_4_ = auVar22._0_4_;
  auVar22._12_4_ = auVar22._0_4_;
  auVar34 = pmulhrsw(auVar33,(undefined1  [16])input[6]);
  auVar24 = pmulhrsw(auVar22,(undefined1  [16])input[6]);
  auVar37 = pshuflw(ZEXT416(0x5a80),ZEXT416(0x5a80),0);
  auVar38._0_4_ = auVar37._0_4_;
  auVar38._4_4_ = auVar38._0_4_;
  auVar38._8_4_ = auVar38._0_4_;
  auVar38._12_4_ = auVar38._0_4_;
  local_118 = (__m128i)pmulhrsw(auVar38,(undefined1  [16])*input);
  local_98 = paddsw(auVar2,auVar20);
  auVar2 = psubsw(auVar2,auVar20);
  auVar37 = psubsw(auVar36,auVar30);
  local_68 = paddsw(auVar36,auVar30);
  local_58 = paddsw(auVar4,auVar32);
  auVar30 = psubsw(auVar4,auVar32);
  auVar20 = psubsw(auVar5,auVar11);
  local_28 = paddsw(auVar11,auVar5);
  cos_bit = -8;
  auVar4 = pshuflw(ZEXT416(0x30f8),ZEXT416(0x30f8),0);
  auVar6._0_4_ = auVar4._0_4_;
  auVar6._4_4_ = auVar6._0_4_;
  auVar6._8_4_ = auVar6._0_4_;
  auVar6._12_4_ = auVar6._0_4_;
  cospi = (int32_t *)0x7640;
  auVar4 = pshuflw(ZEXT416(0x7640),ZEXT416(0x7640),0);
  auVar12._0_4_ = auVar4._0_4_;
  auVar12._4_4_ = auVar12._0_4_;
  auVar12._8_4_ = auVar12._0_4_;
  auVar12._12_4_ = auVar12._0_4_;
  local_f8 = pmulhrsw(auVar6,(undefined1  [16])input[4]);
  local_e8 = pmulhrsw(auVar12,(undefined1  [16])input[4]);
  local_d8 = paddsw(auVar28,auVar34);
  local_c8 = psubsw(auVar28,auVar34);
  local_b8 = psubsw(auVar26,auVar24);
  local_a8 = paddsw(auVar24,auVar26);
  auVar16._0_12_ = auVar2._0_12_;
  auVar16._12_2_ = auVar2._6_2_;
  auVar16._14_2_ = auVar20._6_2_;
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._0_10_ = auVar2._0_10_;
  auVar15._10_2_ = auVar20._4_2_;
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_8_ = auVar2._0_8_;
  auVar14._8_2_ = auVar2._4_2_;
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._6_2_ = auVar20._2_2_;
  auVar13._4_2_ = auVar2._2_2_;
  auVar13._0_2_ = auVar2._0_2_;
  auVar13._2_2_ = auVar20._0_2_;
  auVar4._2_2_ = auVar20._8_2_;
  auVar4._0_2_ = auVar2._8_2_;
  auVar4._4_2_ = auVar2._10_2_;
  auVar4._6_2_ = auVar20._10_2_;
  auVar4._8_2_ = auVar2._12_2_;
  auVar4._10_2_ = auVar20._12_2_;
  auVar4._12_2_ = auVar2._14_2_;
  auVar4._14_2_ = auVar20._14_2_;
  auVar28._8_4_ = 0x61ff138;
  auVar28._0_8_ = 0x61ff138061ff138;
  auVar28._12_4_ = 0x61ff138;
  auVar11 = pmaddwd(auVar13,auVar28);
  auVar20 = pmaddwd(auVar4,auVar28);
  auVar7._8_4_ = 0xec8061f;
  auVar7._0_8_ = 0xec8061f0ec8061f;
  auVar7._12_4_ = 0xec8061f;
  auVar5 = pmaddwd(auVar13,auVar7);
  auVar2 = pmaddwd(auVar4,auVar7);
  auVar21._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar21._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar21._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar21._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar23._0_4_ = auVar20._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar20._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar20._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar20._12_4_ + 0x800 >> 0xc;
  local_88 = packssdw(auVar21,auVar23);
  auVar17._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar5._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar5._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar5._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar5._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  local_38 = packssdw(auVar17,auVar5);
  auVar26._0_12_ = auVar37._0_12_;
  auVar26._12_2_ = auVar37._6_2_;
  auVar26._14_2_ = auVar30._6_2_;
  auVar24._12_4_ = auVar26._12_4_;
  auVar24._0_10_ = auVar37._0_10_;
  auVar24._10_2_ = auVar30._4_2_;
  auVar20._10_6_ = auVar24._10_6_;
  auVar20._0_8_ = auVar37._0_8_;
  auVar20._8_2_ = auVar37._4_2_;
  auVar11._8_8_ = auVar20._8_8_;
  auVar11._6_2_ = auVar30._2_2_;
  auVar11._4_2_ = auVar37._2_2_;
  auVar11._0_2_ = auVar37._0_2_;
  auVar11._2_2_ = auVar30._0_2_;
  auVar8._2_2_ = auVar30._8_2_;
  auVar8._0_2_ = auVar37._8_2_;
  auVar8._4_2_ = auVar37._10_2_;
  auVar8._6_2_ = auVar30._10_2_;
  auVar8._8_2_ = auVar37._12_2_;
  auVar8._10_2_ = auVar30._12_2_;
  auVar8._12_2_ = auVar37._14_2_;
  auVar8._14_2_ = auVar30._14_2_;
  auVar32._8_4_ = 0xf138f9e1;
  auVar32._0_8_ = 0xf138f9e1f138f9e1;
  auVar32._12_4_ = 0xf138f9e1;
  auVar20 = pmaddwd(auVar11,auVar32);
  auVar4 = pmaddwd(auVar32,auVar8);
  auVar2 = pmaddwd(auVar11,auVar28);
  auVar5 = pmaddwd(auVar8,auVar28);
  auVar18._0_4_ = auVar20._0_4_ + 0x800 >> 0xc;
  auVar18._4_4_ = auVar20._4_4_ + 0x800 >> 0xc;
  auVar18._8_4_ = auVar20._8_4_ + 0x800 >> 0xc;
  auVar18._12_4_ = auVar20._12_4_ + 0x800 >> 0xc;
  auVar34._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar34._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar34._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar34._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  local_78 = packssdw(auVar18,auVar34);
  auVar30._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar30._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar30._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar30._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar9._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar9._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar9._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar9._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  local_48 = packssdw(auVar30,auVar9);
  __rounding[1]._0_4_ = 0xec8061f;
  __rounding[0] = 0x61ff138;
  __rounding[1]._4_4_ = 0;
  lVar1 = 0xec8061f;
  local_108 = local_118;
  idct16_stage5_sse2(&local_118,(int32_t *)0x7640,__rounding,-8);
  __rounding_00[1] = lVar1;
  __rounding_00[0] = extraout_RDX;
  idct16_stage6_sse2(&local_118,cospi,__rounding_00,cos_bit);
  idct16_stage7_sse2(output,&local_118);
  return;
}

Assistant:

static void idct16_low8_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);

  // stage 1
  __m128i x[16];
  x[0] = input[0];
  x[2] = input[4];
  x[4] = input[2];
  x[6] = input[6];
  x[8] = input[1];
  x[10] = input[5];
  x[12] = input[3];
  x[14] = input[7];

  // stage 2
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[36], cospi[28], x[14], x[9], x[14]);
  btf_16_ssse3(cospi[44], cospi[20], x[10], x[10], x[13]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);

  // stage 3
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  btf_16_ssse3(-cospi[40], cospi[24], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);

  // stage 4
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_ssse3(cospi[48], cospi[16], x[2], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);

  idct16_stage5_sse2(x, cospi, __rounding, cos_bit);
  idct16_stage6_sse2(x, cospi, __rounding, cos_bit);
  idct16_stage7_sse2(output, x);
}